

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlDoErrValid(xmlValidCtxtPtr ctxt,xmlNodePtr node,xmlParserErrors code,int level,xmlChar *str1
                  ,xmlChar *str2,xmlChar *str3,int int1,char *msg,...)

{
  char in_AL;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_148 [48];
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  int local_8c;
  void *pvStack_88;
  int res;
  void *data;
  xmlGenericErrorFunc channel;
  va_list ap;
  xmlParserCtxtPtr pctxt;
  xmlChar *str2_local;
  xmlChar *str1_local;
  int level_local;
  xmlParserErrors code_local;
  xmlNodePtr node_local;
  xmlValidCtxtPtr ctxt_local;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  ap[0].reg_save_area = (void *)0x0;
  if (ctxt != (xmlValidCtxtPtr)0x0) {
    if ((ctxt->flags & 2) != 0) {
      ap[0].reg_save_area = ctxt->userData;
    }
    ap[0].overflow_arg_area = local_148;
    ap[0]._0_8_ = &stack0x00000020;
    channel._4_4_ = 0x30;
    channel._0_4_ = 0x30;
    if (ap[0].reg_save_area == (void *)0x0) {
      data = (void *)0x0;
      pvStack_88 = (void *)0x0;
      if (ctxt != (xmlValidCtxtPtr)0x0) {
        data = ctxt->error;
        pvStack_88 = ctxt->userData;
      }
      local_8c = xmlVRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)data,pvStack_88,
                                (void *)0x0,node,0x17,code,level,(char *)0x0,0,(char *)str1,
                                (char *)str2,(char *)str2,int1,0,msg,(__va_list_tag *)&channel);
      if (local_8c < 0) {
        xmlVErrMemory(ctxt);
      }
    }
    else {
      xmlCtxtVErr((xmlParserCtxtPtr)ap[0].reg_save_area,node,XML_FROM_VALID,code,level,str1,str2,
                  str3,int1,msg,(__va_list_tag *)&channel);
    }
  }
  return;
}

Assistant:

static void
xmlDoErrValid(xmlValidCtxtPtr ctxt, xmlNodePtr node,
              xmlParserErrors code, int level,
              const xmlChar *str1, const xmlChar *str2, const xmlChar *str3,
              int int1,
              const char *msg, ...) {
    xmlParserCtxtPtr pctxt = NULL;
    va_list ap;

    if (ctxt == NULL)
        return;
    if (ctxt->flags & XML_VCTXT_USE_PCTXT)
        pctxt = ctxt->userData;

    va_start(ap, msg);
    if (pctxt != NULL) {
        xmlCtxtVErr(pctxt, node, XML_FROM_VALID, code, level,
                    str1, str2, str3, int1, msg, ap);
    } else {
        xmlGenericErrorFunc channel = NULL;
        void *data = NULL;
        int res;

        if (ctxt != NULL) {
            channel = ctxt->error;
            data = ctxt->userData;
        }
        res = xmlVRaiseError(NULL, channel, data, NULL, node,
                             XML_FROM_VALID, code, level, NULL, 0,
                             (const char *) str1, (const char *) str2,
                             (const char *) str2, int1, 0,
                             msg, ap);
        if (res < 0)
            xmlVErrMemory(ctxt);
    }
    va_end(ap);
}